

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verify.c
# Opt level: O1

int mmk_verify_times(mmk_verify_params *params)

{
  ulong uVar1;
  int iVar2;
  long in_FS_OFFSET;
  
  uVar1 = *(ulong *)(in_FS_OFFSET + -0x10);
  if (params->never == 0) {
    if ((params->at_least != 0) || (params->at_most != 0)) {
      return (int)((uVar1 <= params->at_most || params->at_most == 0) && params->at_least <= uVar1);
    }
    if (params->matching != (_func_int_size_t *)0x0) {
      iVar2 = (*params->matching)(uVar1);
      return iVar2;
    }
    if (params->times == 0) {
      return 1;
    }
    uVar1 = params->times - uVar1;
  }
  return (int)(uVar1 == 0);
}

Assistant:

int mmk_verify_times(struct mmk_verify_params *params)
{
    size_t t = tls_get(size_t, times);
    if (params->never)
        return t == 0;
    if (params->at_least || params->at_most) {
        size_t most = params->at_most ? params->at_most : t;
        return t >= params->at_least && t <= most;
    }
    if (params->matching)
        return params->matching(t);
    if (params->times > 0)
        return params->times == t;
    return 1;
}